

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O3

void resampler_set_quality(void *_r,int quality)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 5;
  if ((uint)quality < 5) {
    uVar1 = quality;
  }
  uVar2 = 0;
  if (-1 < quality) {
    uVar2 = uVar1;
  }
  if (uVar2 != *(byte *)((long)_r + 0x30)) {
    if (((uVar2 | 2) == 3) || ((*(byte *)((long)_r + 0x30) | 2) == 3)) {
      *(undefined8 *)((long)_r + 8) = 0;
      memset((void *)((long)_r + 0x248),0,0x17c);
      *(undefined8 *)((long)_r + 0x38) = 0;
      *(undefined8 *)((long)_r + 0x40) = 0;
    }
    *(undefined2 *)((long)_r + 0x31) = 0xffff;
  }
  *(char *)((long)_r + 0x30) = (char)uVar2;
  return;
}

Assistant:

void resampler_set_quality(void *_r, int quality)
{
    resampler * r = ( resampler * ) _r;
    if (quality < RESAMPLER_QUALITY_MIN)
        quality = RESAMPLER_QUALITY_MIN;
    else if (quality > RESAMPLER_QUALITY_MAX)
        quality = RESAMPLER_QUALITY_MAX;
    if ( r->quality != quality )
    {
        if ( quality == RESAMPLER_QUALITY_BLEP || r->quality == RESAMPLER_QUALITY_BLEP ||
             quality == RESAMPLER_QUALITY_BLAM || r->quality == RESAMPLER_QUALITY_BLAM )
        {
            r->read_pos = 0;
            r->read_filled = 0;
            r->last_amp = 0;
            r->accumulator = 0;
            memset( r->buffer_out, 0, sizeof(r->buffer_out) );
        }
        r->delay_added = -1;
        r->delay_removed = -1;
    }
    r->quality = (unsigned char)quality;
}